

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_reader.cc
# Opt level: O1

int main(int argc,char **argv)

{
  size_type *psVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  ostream *poVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined1 local_b8 [8];
  string str;
  properties_type cpp_properties;
  undefined1 local_78 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  
  if (argc == 1) {
    pcVar6 = "full.properties";
  }
  else {
    pcVar6 = argv[1];
  }
  read_from_file_abi_cxx11_((string *)local_b8,pcVar6);
  auVar2 = local_b8;
  pcVar6 = str._M_dataplus._M_p + (long)local_b8;
  str.field_2._8_8_ = 0;
  bVar3 = tokenize_and_parse<properties_actor_traits,properties_actor<properties_actor_traits>,cpp_properties::properties_action<properties_actor<properties_actor_traits>>>
                    ((char *)local_b8,pcVar6,(properties_type *)((long)&str.field_2 + 8));
  if (bVar3) {
    if (str.field_2._8_8_ != 0) {
      uVar5 = str.field_2._8_8_;
      do {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)uVar5);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_78,(long)p.first._M_dataplus._M_p);
        p.second.field_2._M_local_buf[0xf] = '=';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,p.second.field_2._M_local_buf + 0xf,1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)p.first.field_2._8_8_,(long)p.second._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((size_type *)p.first.field_2._8_8_ != &p.second._M_string_length) {
          operator_delete((void *)p.first.field_2._8_8_,p.second._M_string_length + 1);
        }
        if (local_78 != (undefined1  [8])&p.first._M_string_length) {
          operator_delete((void *)local_78,p.first._M_string_length + 1);
        }
        uVar5 = uVar5 + 0x40;
      } while ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)uVar5 !=
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0);
    }
  }
  else {
    psVar1 = &p.first._M_string_length;
    local_78 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,auVar2,pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Lexical analysis failed\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stopped at: \"",0xd);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_78,(long)p.first._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
    if (local_78 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_78,p.first._M_string_length + 1);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&str.field_2 + 8));
  if (local_b8 != (undefined1  [8])&str._M_string_length) {
    operator_delete((void *)local_b8,str._M_string_length + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    // read input from the given file
    std::string str(read_from_file(1 == argc ? "full.properties" : argv[1]));

    // tokenize the given string, the bound functor gets invoked for each of
    // the matched tokens
    char const* first = str.c_str();
    char const* last = &first[str.size()];

    properties_actor_traits::properties_type cpp_properties;

    bool success = tokenize_and_parse<properties_actor_traits>(first, last, cpp_properties);

    // print results
    if (success) {
        for (auto p : cpp_properties) {
            std::cout << p.first << '=' << p.second << "\n";
        }
    } else {
        std::string rest(first, last);
        std::cout << "Lexical analysis failed\n"
            << "stopped at: \"" << rest << "\"\n";
    }
    return 0;
}